

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-timerfd.c
# Opt level: O3

void dotest(int clockid)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  long lVar4;
  long lVar5;
  timespec tVar6;
  timespec tVar7;
  int fd;
  uint64_t counter;
  pollfd pfd;
  itimerspec tout;
  itimerspec t8;
  pthread_t th2;
  itimerspec t4;
  itimerspec t9;
  itimerspec t7;
  itimerspec t6;
  itimerspec t5;
  itimerspec t46;
  itimerspec t45;
  itimerspec t3;
  itimerspec t2;
  itimerspec t1;
  char buf [1024];
  timespec tStack_5e8;
  int local_5cc;
  ulong local_5c8;
  pollfd local_5c0;
  itimerspec local_5b8;
  itimerspec local_598;
  pthread_t local_570;
  itimerspec local_568;
  itimerspec local_548;
  itimerspec local_528;
  itimerspec local_508;
  itimerspec local_4e8;
  itimerspec local_4c8;
  itimerspec local_4a8;
  itimerspec local_488;
  itimerspec local_468;
  itimerspec local_448;
  undefined1 local_428 [1032];
  
  tStack_5e8.tv_nsec = 0x102b47;
  piVar2 = __errno_location();
  *piVar2 = 0;
  tStack_5e8.tv_nsec = 0x102b5c;
  local_5cc = timerfd_create(clockid,0x800);
  if (local_5cc < 0) {
    tStack_5e8.tv_nsec = 0x103573;
    dotest_cold_107();
LAB_00103573:
    tStack_5e8.tv_nsec = 0x103578;
    dotest_cold_1();
LAB_00103578:
    tStack_5e8.tv_nsec = 0x10357d;
    dotest_cold_2();
LAB_0010357d:
    tStack_5e8.tv_nsec = 0x103582;
    dotest_cold_3();
LAB_00103582:
    tStack_5e8.tv_nsec = 0x103587;
    dotest_cold_4();
LAB_00103587:
    tStack_5e8.tv_nsec = 0x10358c;
    dotest_cold_5();
LAB_0010358c:
    tStack_5e8.tv_nsec = 0x103591;
    dotest_cold_6();
LAB_00103591:
    tStack_5e8.tv_nsec = 0x103596;
    dotest_cold_106();
LAB_00103596:
    tStack_5e8.tv_nsec = 0x10359b;
    dotest_cold_7();
LAB_0010359b:
    tStack_5e8.tv_nsec = 0x1035a0;
    dotest_cold_8();
LAB_001035a0:
    tStack_5e8.tv_nsec = 0x1035a5;
    dotest_cold_9();
LAB_001035a5:
    tStack_5e8.tv_nsec = 0x1035aa;
    dotest_cold_10();
LAB_001035aa:
    tStack_5e8.tv_nsec = 0x1035af;
    dotest_cold_11();
LAB_001035af:
    tStack_5e8.tv_nsec = 0x1035b4;
    dotest_cold_12();
LAB_001035b4:
    tStack_5e8.tv_nsec = 0x1035b9;
    dotest_cold_13();
LAB_001035b9:
    tStack_5e8.tv_nsec = 0x1035be;
    dotest_cold_105();
LAB_001035be:
    tStack_5e8.tv_nsec = 0x1035c3;
    dotest_cold_14();
LAB_001035c3:
    tStack_5e8.tv_nsec = 0x1035c8;
    dotest_cold_15();
LAB_001035c8:
    tStack_5e8.tv_nsec = 0x1035cd;
    dotest_cold_16();
LAB_001035cd:
    tStack_5e8.tv_nsec = 0x1035d2;
    dotest_cold_17();
LAB_001035d2:
    tStack_5e8.tv_nsec = 0x1035d7;
    dotest_cold_18();
LAB_001035d7:
    tStack_5e8.tv_nsec = 0x1035dc;
    dotest_cold_19();
LAB_001035dc:
    tStack_5e8.tv_nsec = 0x1035e1;
    dotest_cold_20();
LAB_001035e1:
    tStack_5e8.tv_nsec = 0x1035e6;
    dotest_cold_21();
LAB_001035e6:
    tStack_5e8.tv_nsec = 0x1035eb;
    dotest_cold_22();
LAB_001035eb:
    tStack_5e8.tv_nsec = 0x1035f0;
    dotest_cold_23();
LAB_001035f0:
    tStack_5e8.tv_nsec = 0x1035f5;
    dotest_cold_104();
LAB_001035f5:
    tStack_5e8.tv_nsec = 0x1035fa;
    dotest_cold_24();
LAB_001035fa:
    tStack_5e8.tv_nsec = 0x1035ff;
    dotest_cold_25();
LAB_001035ff:
    tStack_5e8.tv_nsec = 0x103604;
    dotest_cold_26();
LAB_00103604:
    tStack_5e8.tv_nsec = 0x103609;
    dotest_cold_27();
LAB_00103609:
    tStack_5e8.tv_nsec = 0x10360e;
    dotest_cold_103();
LAB_0010360e:
    tStack_5e8.tv_nsec = 0x103613;
    dotest_cold_28();
LAB_00103613:
    tStack_5e8.tv_nsec = 0x103618;
    dotest_cold_29();
LAB_00103618:
    tStack_5e8.tv_nsec = 0x10361d;
    dotest_cold_30();
LAB_0010361d:
    tStack_5e8.tv_nsec = 0x103622;
    dotest_cold_102();
LAB_00103622:
    tStack_5e8.tv_nsec = 0x103627;
    dotest_cold_31();
LAB_00103627:
    tStack_5e8.tv_nsec = 0x10362c;
    dotest_cold_32();
LAB_0010362c:
    tStack_5e8.tv_nsec = 0x103631;
    dotest_cold_33();
LAB_00103631:
    tStack_5e8.tv_nsec = 0x103636;
    dotest_cold_34();
LAB_00103636:
    tStack_5e8.tv_nsec = 0x10363b;
    dotest_cold_35();
LAB_0010363b:
    tStack_5e8.tv_nsec = 0x103640;
    dotest_cold_36();
LAB_00103640:
    tStack_5e8.tv_nsec = 0x103645;
    dotest_cold_37();
LAB_00103645:
    tStack_5e8.tv_nsec = 0x10364a;
    dotest_cold_101();
LAB_0010364a:
    tStack_5e8.tv_nsec = 0x10364f;
    dotest_cold_38();
LAB_0010364f:
    tStack_5e8.tv_nsec = 0x103654;
    dotest_cold_39();
LAB_00103654:
    tStack_5e8.tv_nsec = 0x103659;
    dotest_cold_40();
LAB_00103659:
    tStack_5e8.tv_nsec = 0x10365e;
    dotest_cold_41();
LAB_0010365e:
    tStack_5e8.tv_nsec = 0x103663;
    dotest_cold_100();
LAB_00103663:
    tStack_5e8.tv_nsec = 0x103668;
    dotest_cold_99();
LAB_00103668:
    tStack_5e8.tv_nsec = 0x10366d;
    dotest_cold_42();
LAB_0010366d:
    tStack_5e8.tv_nsec = 0x103672;
    dotest_cold_98();
LAB_00103672:
    tStack_5e8.tv_nsec = 0x103677;
    dotest_cold_43();
LAB_00103677:
    tStack_5e8.tv_nsec = 0x10367c;
    dotest_cold_97();
LAB_0010367c:
    tStack_5e8.tv_nsec = 0x103681;
    dotest_cold_44();
LAB_00103681:
    tStack_5e8.tv_nsec = 0x103686;
    dotest_cold_45();
LAB_00103686:
    tStack_5e8.tv_nsec = 0x10368b;
    dotest_cold_96();
LAB_0010368b:
    tStack_5e8.tv_nsec = 0x103690;
    dotest_cold_46();
LAB_00103690:
    tStack_5e8.tv_nsec = 0x103695;
    dotest_cold_95();
LAB_00103695:
    tStack_5e8.tv_nsec = 0x10369a;
    dotest_cold_47();
LAB_0010369a:
    tStack_5e8.tv_nsec = 0x10369f;
    dotest_cold_94();
LAB_0010369f:
    tStack_5e8.tv_nsec = 0x1036a4;
    dotest_cold_48();
LAB_001036a4:
    tStack_5e8.tv_nsec = 0x1036a9;
    dotest_cold_49();
LAB_001036a9:
    tStack_5e8.tv_nsec = 0x1036ae;
    dotest_cold_50();
LAB_001036ae:
    tStack_5e8.tv_nsec = 0x1036b3;
    dotest_cold_93();
LAB_001036b3:
    tStack_5e8.tv_nsec = 0x1036b8;
    dotest_cold_51();
LAB_001036b8:
    tStack_5e8.tv_nsec = 0x1036bd;
    dotest_cold_92();
LAB_001036bd:
    tStack_5e8.tv_nsec = 0x1036c2;
    dotest_cold_52();
LAB_001036c2:
    tStack_5e8.tv_nsec = 0x1036c7;
    dotest_cold_53();
LAB_001036c7:
    tStack_5e8.tv_nsec = 0x1036cc;
    dotest_cold_91();
LAB_001036cc:
    tStack_5e8.tv_nsec = 0x1036d1;
    dotest_cold_54();
LAB_001036d1:
    tStack_5e8.tv_nsec = 0x1036d6;
    dotest_cold_55();
LAB_001036d6:
    tStack_5e8.tv_nsec = 0x1036db;
    dotest_cold_56();
LAB_001036db:
    tStack_5e8.tv_nsec = 0x1036e0;
    dotest_cold_57();
LAB_001036e0:
    tStack_5e8.tv_nsec = 0x1036e5;
    dotest_cold_58();
LAB_001036e5:
    tStack_5e8.tv_nsec = 0x1036ea;
    dotest_cold_90();
LAB_001036ea:
    tStack_5e8.tv_nsec = 0x1036ef;
    dotest_cold_89();
LAB_001036ef:
    tStack_5e8.tv_nsec = 0x1036f4;
    dotest_cold_59();
LAB_001036f4:
    tStack_5e8.tv_nsec = 0x1036f9;
    dotest_cold_88();
LAB_001036f9:
    tStack_5e8.tv_nsec = 0x1036fe;
    dotest_cold_60();
LAB_001036fe:
    tStack_5e8.tv_nsec = 0x103703;
    dotest_cold_61();
LAB_00103703:
    tStack_5e8.tv_nsec = 0x103708;
    dotest_cold_62();
LAB_00103708:
    tStack_5e8.tv_nsec = 0x10370d;
    dotest_cold_63();
LAB_0010370d:
    tStack_5e8.tv_nsec = 0x103712;
    dotest_cold_87();
LAB_00103712:
    tStack_5e8.tv_nsec = 0x103717;
    dotest_cold_86();
LAB_00103717:
    tStack_5e8.tv_nsec = 0x10371c;
    dotest_cold_85();
LAB_0010371c:
    tStack_5e8.tv_nsec = 0x103721;
    dotest_cold_64();
LAB_00103721:
    tStack_5e8.tv_nsec = 0x103726;
    dotest_cold_65();
LAB_00103726:
    tStack_5e8.tv_nsec = 0x10372b;
    dotest_cold_66();
LAB_0010372b:
    tStack_5e8.tv_nsec = 0x103730;
    dotest_cold_67();
LAB_00103730:
    tStack_5e8.tv_nsec = 0x103735;
    dotest_cold_84();
LAB_00103735:
    tStack_5e8.tv_nsec = 0x10373a;
    dotest_cold_83();
LAB_0010373a:
    tStack_5e8.tv_nsec = 0x10373f;
    dotest_cold_82();
LAB_0010373f:
    tStack_5e8.tv_nsec = 0x103744;
    dotest_cold_68();
LAB_00103744:
    tStack_5e8.tv_nsec = 0x103749;
    dotest_cold_69();
LAB_00103749:
    tStack_5e8.tv_nsec = 0x10374e;
    dotest_cold_70();
LAB_0010374e:
    tStack_5e8.tv_nsec = 0x103753;
    dotest_cold_71();
LAB_00103753:
    tStack_5e8.tv_nsec = 0x103758;
    dotest_cold_81();
LAB_00103758:
    tStack_5e8.tv_nsec = 0x10375d;
    dotest_cold_80();
LAB_0010375d:
    tStack_5e8.tv_nsec = 0x103762;
    dotest_cold_79();
LAB_00103762:
    tStack_5e8.tv_nsec = 0x103767;
    dotest_cold_72();
LAB_00103767:
    tStack_5e8.tv_nsec = 0x10376c;
    dotest_cold_78();
LAB_0010376c:
    tStack_5e8.tv_nsec = 0x103771;
    dotest_cold_73();
LAB_00103771:
    tStack_5e8.tv_nsec = 0x103776;
    dotest_cold_74();
LAB_00103776:
    tStack_5e8.tv_nsec = 0x10377b;
    dotest_cold_75();
  }
  else {
    if (*piVar2 != 0) goto LAB_00103573;
    local_5c0.events = 1;
    local_5c0.revents = 0;
    tStack_5e8.tv_nsec = 0x102b8b;
    local_5c0.fd = local_5cc;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_00103578;
    tStack_5e8.tv_nsec = 0x102ba9;
    sVar3 = read(local_5cc,local_428,0x400);
    if (sVar3 != -1) goto LAB_0010357d;
    if (*piVar2 != 0xb) goto LAB_00103582;
    tStack_5e8.tv_nsec = 0x102bd2;
    sVar3 = read(local_5cc,local_428,7);
    if (sVar3 != -1) goto LAB_00103587;
    if (*piVar2 != 0x16) goto LAB_0010358c;
    local_448.it_value.tv_sec = 0;
    local_448.it_value.tv_nsec = 500000000;
    local_448.it_interval.tv_sec = 0;
    local_448.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102c15;
    iVar1 = timerfd_settime(local_5cc,0,&local_448,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_00103591;
    if (*piVar2 != 0) goto LAB_00103596;
    tStack_5e8.tv_nsec = 0x102c3c;
    sVar3 = read(local_5cc,local_428,0x400);
    if (sVar3 != -1) goto LAB_0010359b;
    if (*piVar2 != 0xb) goto LAB_001035a0;
    tStack_5e8.tv_nsec = 0x102c59;
    sleep(1);
    tStack_5e8.tv_nsec = 0x102c6c;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_001035a5;
    if (local_5c8 != 1) goto LAB_001035aa;
    tStack_5e8.tv_nsec = 0x102c95;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != -1) goto LAB_001035af;
    if (*piVar2 != 0xb) goto LAB_001035b4;
    local_468.it_value.tv_sec = 0;
    local_468.it_value.tv_nsec = 300000000;
    local_468.it_interval.tv_sec = 0;
    local_468.it_interval.tv_nsec = 200000000;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102cd8;
    iVar1 = timerfd_settime(local_5cc,0,&local_468,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001035b9;
    if (*piVar2 != 0) goto LAB_001035be;
    tStack_5e8.tv_nsec = 0x102cff;
    sVar3 = read(local_5cc,local_428,0x400);
    if (sVar3 != -1) goto LAB_001035c3;
    if (*piVar2 != 0xb) goto LAB_001035c8;
    tStack_5e8.tv_nsec = 0x102d1c;
    iVar1 = usleep(400000);
    if (iVar1 != 0) goto LAB_001035cd;
    tStack_5e8.tv_nsec = 0x102d35;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 1) goto LAB_001035d2;
    if (local_5c0.revents != 1) goto LAB_001035d7;
    tStack_5e8.tv_nsec = 0x102d54;
    iVar1 = usleep(400000);
    if (iVar1 != 0) goto LAB_001035dc;
    tStack_5e8.tv_nsec = 0x102d6d;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 1) goto LAB_001035e1;
    if (local_5c0.revents != 1) goto LAB_001035e6;
    tStack_5e8.tv_nsec = 0x102d95;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_001035eb;
    if (local_5c8 < 3) goto LAB_001035f0;
    if (local_5c8 != 3) goto LAB_001035f5;
    tStack_5e8.tv_nsec = 0x102dcb;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != -1) goto LAB_001035fa;
    if (*piVar2 != 0xb) goto LAB_001035ff;
    tStack_5e8.tv_nsec = 0x102de8;
    usleep(400000);
    tStack_5e8.tv_nsec = 0x102df9;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 1) goto LAB_00103604;
    local_488.it_value.tv_sec = 0;
    local_488.it_value.tv_nsec = 0;
    local_488.it_interval.tv_sec = 0;
    local_488.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102e27;
    iVar1 = timerfd_settime(local_5cc,0,&local_488,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_00103609;
    if (*piVar2 != 0) goto LAB_0010360e;
    tStack_5e8.tv_nsec = 0x102e49;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_00103613;
    tStack_5e8.tv_nsec = 0x102e5b;
    usleep(400000);
    tStack_5e8.tv_nsec = 0x102e6c;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_00103618;
    local_568.it_value.tv_sec = 0;
    local_568.it_value.tv_nsec = 0;
    local_568.it_interval.tv_sec = 0;
    local_568.it_interval.tv_nsec = 0;
    tStack_5e8.tv_nsec = 0x102e92;
    clock_gettime(clockid,&local_568.it_value);
    lVar4 = local_568.it_value.tv_nsec + 300000000;
    if (699999999 < local_568.it_value.tv_nsec) {
      local_568.it_value.tv_sec = local_568.it_value.tv_sec + 1;
      lVar4 = local_568.it_value.tv_nsec + -700000000;
    }
    local_568.it_value.tv_nsec = lVar4;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102eda;
    iVar1 = timerfd_settime(local_5cc,1,&local_568,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_0010361d;
    if (*piVar2 != 0) goto LAB_00103622;
    tStack_5e8.tv_nsec = 0x102f01;
    sVar3 = read(local_5cc,local_428,0x400);
    if (sVar3 != -1) goto LAB_00103627;
    if (*piVar2 != 0xb) goto LAB_0010362c;
    tStack_5e8.tv_nsec = 0x102f1e;
    usleep(500000);
    tStack_5e8.tv_nsec = 0x102f31;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_00103631;
    if (local_5c8 != 1) goto LAB_00103636;
    tStack_5e8.tv_nsec = 0x102f5a;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != -1) goto LAB_0010363b;
    if (*piVar2 != 0xb) goto LAB_00103640;
    local_4a8.it_value.tv_sec = 0;
    local_4a8.it_value.tv_nsec = 400000000;
    local_4a8.it_interval.tv_sec = 0;
    local_4a8.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102f9d;
    iVar1 = timerfd_settime(local_5cc,0,&local_4a8,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_00103645;
    if (*piVar2 != 0) goto LAB_0010364a;
    tStack_5e8.tv_nsec = 0x102fb3;
    tVar6 = steady_clock_now();
    tStack_5e8.tv_nsec = 0x102fca;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_0010364f;
    tStack_5e8.tv_nsec = 0x102fe6;
    iVar1 = poll(&local_5c0,1,100);
    if (iVar1 != 0) goto LAB_00103654;
    tStack_5e8.tv_nsec = 0x103002;
    iVar1 = poll(&local_5c0,1,1000);
    if (iVar1 != 1) goto LAB_00103659;
    tStack_5e8.tv_nsec = 0x103010;
    tVar7 = steady_clock_now();
    lVar5 = tVar7.tv_nsec - tVar6.tv_nsec;
    lVar4 = lVar5 + 1000000000;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    if (((lVar5 >> 0x3f) + (tVar7.tv_sec - tVar6.tv_sec)) * 1000000000 + lVar4 < 300000000)
    goto LAB_0010365e;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103050;
    iVar1 = close(local_5cc);
    if (iVar1 < 0) goto LAB_00103663;
    if (*piVar2 != 0) goto LAB_00103668;
    tStack_5e8.tv_nsec = 0x10306a;
    local_5cc = timerfd_create(0,0);
    if (local_5cc < 0) goto LAB_0010366d;
    if (*piVar2 != 0) goto LAB_00103672;
    local_4c8.it_value.tv_sec = 10;
    local_4c8.it_value.tv_nsec = 0;
    local_4c8.it_interval.tv_sec = 0;
    local_4c8.it_interval.tv_nsec = 0;
    tStack_5e8.tv_nsec = 0x1030ab;
    local_5c0.fd = local_5cc;
    iVar1 = timerfd_settime(local_5cc,0,&local_4c8,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_00103677;
    if (*piVar2 != 0) goto LAB_0010367c;
    tStack_5e8.tv_nsec = 0x1030cd;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_00103681;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x1030e4;
    iVar1 = close(local_5cc);
    if (iVar1 < 0) goto LAB_00103686;
    if (*piVar2 != 0) goto LAB_0010368b;
    tStack_5e8.tv_nsec = 0x1030fe;
    local_5cc = timerfd_create(0,0);
    if (local_5cc < 0) goto LAB_00103690;
    if (*piVar2 != 0) goto LAB_00103695;
    local_4e8.it_value.tv_sec = 0;
    local_4e8.it_value.tv_nsec = 500000000;
    local_4e8.it_interval.tv_sec = 0;
    local_4e8.it_interval.tv_nsec = 0;
    tStack_5e8.tv_nsec = 0x10313f;
    local_5c0.fd = local_5cc;
    iVar1 = timerfd_settime(local_5cc,0,&local_4e8,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_0010369a;
    if (*piVar2 != 0) goto LAB_0010369f;
    tStack_5e8.tv_nsec = 0x103155;
    tVar6 = steady_clock_now();
    tStack_5e8.tv_nsec = 0x10316e;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_001036a4;
    if (local_5c8 != 1) goto LAB_001036a9;
    tStack_5e8.tv_nsec = 0x103189;
    tVar7 = steady_clock_now();
    lVar5 = tVar7.tv_nsec - tVar6.tv_nsec;
    lVar4 = lVar5 + 1000000000;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    if (((lVar5 >> 0x3f) + (tVar7.tv_sec - tVar6.tv_sec)) * 1000000000 + lVar4 < 400000000)
    goto LAB_001036ae;
    tStack_5e8.tv_nsec = 0x1031d2;
    iVar1 = pthread_create(&local_570,(pthread_attr_t *)0x0,th2_func,&local_5cc);
    if (iVar1 != 0) goto LAB_001036b3;
    tStack_5e8.tv_nsec = 0x1031e4;
    usleep(400000);
    local_508.it_value.tv_sec = 0;
    local_508.it_value.tv_nsec = 200000000;
    local_508.it_interval.tv_sec = 0;
    local_508.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103214;
    iVar1 = timerfd_settime(local_5cc,0,&local_508,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001036b8;
    if (*piVar2 != 0) goto LAB_001036bd;
    tStack_5e8.tv_nsec = 0x103231;
    iVar1 = pthread_join(local_570,(void **)0x0);
    if (iVar1 != 0) goto LAB_001036c2;
    local_528.it_value.tv_sec = 0;
    local_528.it_value.tv_nsec = 500000000;
    local_528.it_interval.tv_sec = 0;
    local_528.it_interval.tv_nsec = 200000000;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103269;
    iVar1 = timerfd_settime(local_5cc,0,&local_528,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001036c7;
    if (*piVar2 != 0) goto LAB_001036cc;
    tStack_5e8.tv_nsec = 0x10327f;
    tVar6 = steady_clock_now();
    tStack_5e8.tv_nsec = 0x103298;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_001036d1;
    if (local_5c8 != 1) goto LAB_001036d6;
    tStack_5e8.tv_nsec = 0x1032c1;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_001036db;
    if (local_5c8 != 1) goto LAB_001036e0;
    tStack_5e8.tv_nsec = 0x1032dc;
    tVar7 = steady_clock_now();
    lVar5 = tVar7.tv_nsec - tVar6.tv_nsec;
    lVar4 = lVar5 + 1000000000;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    if (((lVar5 >> 0x3f) + (tVar7.tv_sec - tVar6.tv_sec)) * 1000000000 + lVar4 < 600000000)
    goto LAB_001036e5;
    local_598.it_value.tv_sec = 0;
    local_598.it_value.tv_nsec = 300000000;
    local_598.it_interval.tv_sec = 0;
    local_598.it_interval.tv_nsec = 400000000;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x10333a;
    iVar1 = timerfd_settime(local_5cc,0,&local_598,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001036ea;
    if (*piVar2 != 0) goto LAB_001036ef;
    tStack_5e8.tv_nsec = 0x103359;
    iVar1 = timerfd_gettime(local_5cc,&local_5b8);
    if (iVar1 < 0) goto LAB_001036f4;
    if (*piVar2 != 0) goto LAB_001036f9;
    if (local_5b8.it_interval.tv_sec != local_598.it_interval.tv_sec) goto LAB_001036fe;
    if (local_5b8.it_interval.tv_nsec != local_598.it_interval.tv_nsec) goto LAB_00103703;
    if (local_5b8.it_value.tv_sec != local_598.it_value.tv_sec) goto LAB_00103708;
    if (local_598.it_value.tv_nsec < local_5b8.it_value.tv_nsec) goto LAB_0010370d;
    if (local_5b8.it_value.tv_nsec < local_598.it_value.tv_nsec + -100000000) goto LAB_00103712;
    tStack_5e8.tv_nsec = 0x1033c6;
    usleep(100000);
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x1033da;
    iVar1 = timerfd_gettime(local_5cc,&local_5b8);
    if (iVar1 < 0) goto LAB_00103717;
    if (*piVar2 != 0) goto LAB_0010371c;
    if (local_5b8.it_interval.tv_sec != local_598.it_interval.tv_sec) goto LAB_00103721;
    if (local_5b8.it_interval.tv_nsec != local_598.it_interval.tv_nsec) goto LAB_00103726;
    if (local_5b8.it_value.tv_sec != local_598.it_value.tv_sec) goto LAB_0010372b;
    if (local_598.it_value.tv_nsec + -100000000 < local_5b8.it_value.tv_nsec) goto LAB_00103730;
    if (local_5b8.it_value.tv_nsec < local_598.it_value.tv_nsec + -200000000) goto LAB_00103735;
    tStack_5e8.tv_nsec = 0x10344e;
    usleep(300000);
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103462;
    iVar1 = timerfd_gettime(local_5cc,&local_5b8);
    if (iVar1 < 0) goto LAB_0010373a;
    if (*piVar2 != 0) goto LAB_0010373f;
    if (local_5b8.it_interval.tv_sec != local_598.it_interval.tv_sec) goto LAB_00103744;
    if (local_5b8.it_interval.tv_nsec != local_598.it_interval.tv_nsec) goto LAB_00103749;
    if (local_5b8.it_value.tv_sec != local_598.it_value.tv_sec) goto LAB_0010374e;
    if (local_5b8.it_value.tv_nsec < 200000000) goto LAB_00103753;
    if (400000000 < (ulong)local_5b8.it_value.tv_nsec) goto LAB_00103758;
    local_548.it_value.tv_sec = 0;
    local_548.it_value.tv_nsec = 100000000;
    local_548.it_interval.tv_sec = 0;
    local_548.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x1034f0;
    iVar1 = timerfd_settime(local_5cc,0,&local_548,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_0010375d;
    if (*piVar2 != 0) goto LAB_00103762;
    tStack_5e8.tv_nsec = 0x10350b;
    usleep(200000);
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x10351f;
    iVar1 = timerfd_gettime(local_5cc,&local_5b8);
    if (iVar1 < 0) goto LAB_00103767;
    if (*piVar2 != 0) goto LAB_0010376c;
    if (local_5b8.it_interval.tv_sec != 0) goto LAB_00103771;
    if (local_5b8.it_interval.tv_nsec != 0) goto LAB_00103776;
    if (local_5b8.it_value.tv_sec == 0) {
      if (local_5b8.it_value.tv_nsec == 0) {
        return;
      }
      goto LAB_00103780;
    }
  }
  tStack_5e8.tv_nsec = 0x103780;
  dotest_cold_76();
LAB_00103780:
  tStack_5e8.tv_nsec = (long)steady_clock_now;
  dotest_cold_77();
  iVar1 = clock_gettime(1,&tStack_5e8);
  if (-1 < iVar1) {
    return;
  }
  abort();
}

Assistant:

static void
dotest(int clockid)
{
	int fd;
	expect_success(fd, timerfd_create(clockid, TFD_NONBLOCK));
	int junk;

	// Before we set a timer, timerfd has no events for polling or reading
	struct pollfd pfd = { .fd = fd, .events = POLLIN };
	expect(poll(&pfd, 1, 0), 0);
	char buf[1024];
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	// Reading less than 8 bytes result in an error
	expect_errno(read(fd, buf, 7), EINVAL);

	// Set a timer to expire in 500ms from now (relative time)
	struct itimerspec t1 = { { 0, 0 }, { 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t1, NULL));
	// If we check now, the timer should have not yet expired
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	// But if we sleep for a whole second, the timer would have expired and
	// read returns a counter of 1
	sleep(1);
	u64 counter;
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// Similarly, set a timer to expire in 300ms, and then again every
	// 200ms. After 400ms, poll sees the timer expired at least once, but
	// we do not read. After 400ms more, we read and see the timer expired
	// 3 times.
	struct itimerspec t2 = { { 0, MS_TO_NSEC(200) },
		{ 0, MS_TO_NSEC(300) } };
	expect_success(junk, timerfd_settime(fd, 0, &t2, NULL));
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	expect(usleep(400000), 0);
#ifdef ALLOW_TIMER_SLACK
	expect(poll(&pfd, 1, -1), 1);
#else
	expect(poll(&pfd, 1, 0), 1);
#endif
	expect((int)pfd.revents, POLLIN);
	expect(usleep(400000), 0);
#ifdef ALLOW_TIMER_SLACK
	expect(poll(&pfd, 1, -1), 1);
#else
	expect(poll(&pfd, 1, 0), 1);
#endif
	expect((int)pfd.revents, POLLIN);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expectge(counter, (u64)3);
#ifndef ALLOW_TIMER_SLACK
	expect(counter, (u64)3);
#endif
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// If sleep (so counter becomes nonzero again) and then cancel the
	// timer, the counter remains zero
	usleep(400000);
	expect(poll(&pfd, 1, 0), 1); // counter is nonzero
	struct itimerspec t3 = { { 0, 0 }, { 0, 0 } };
	expect_success(junk, timerfd_settime(fd, 0, &t3, NULL));
	expect(poll(&pfd, 1, 0), 0); // counter is back to zero
	usleep(400000);
	expect(poll(&pfd, 1, 0), 0); // and timer was really canceled

	// Check absolute time setting
	// Set a timer to expire in 300ms from now (using absolute time)
	struct itimerspec t4 = { { 0, 0 }, { 0, 0 } };
	clock_gettime(clockid, &(t4.it_value));
	t4.it_value.tv_nsec += MS_TO_NSEC(300);
	if (t4.it_value.tv_nsec >= MS_TO_NSEC(1000)) {
		t4.it_value.tv_nsec -= MS_TO_NSEC(1000);
		t4.it_value.tv_sec++;
	}
	expect_success(junk, timerfd_settime(fd, TFD_TIMER_ABSTIME, &t4, NULL));
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	usleep(500000);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// Check blocking poll - simple case, no interval (see more complex
	// cases in blocking read tests below).
	struct itimerspec t45 = { { 0, 0 }, { 0, MS_TO_NSEC(400) } };
	expect_success(junk, timerfd_settime(fd, 0, &t45, NULL));
	struct timespec before = steady_clock_now();
	expect(poll(&pfd, 1, 0), 0);
	expect(poll(&pfd, 1, 100 /*ms*/), 0);
	expect(poll(&pfd, 1, 1000 /*ms*/), 1);
	struct timespec after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(300));

	// Check close
	expect_success(junk, close(fd));

	// Check that it's not a disaster to close an fd with a yet-unexpired
	// timer
	expect_success(fd, timerfd_create(CLOCK_REALTIME, 0));
	pfd.fd = fd;
	struct itimerspec t46 = { { 0, 0 }, { 10, 0 } };
	expect_success(junk, timerfd_settime(fd, 0, &t46, NULL));
	expect(poll(&pfd, 1, 0), 0);
	expect_success(junk, close(fd));

	// Open again with blocking read enabled
	expect_success(fd, timerfd_create(CLOCK_REALTIME, 0));
	pfd.fd = fd;

	// Check blocking read, no interval, timer set before read blocks
	struct itimerspec t5 = { { 0, 0 }, { 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t5, NULL));
	before = steady_clock_now();
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(400));

	// Check blocking read, no interval, timer set after read blocks
	pthread_t th2;
	expect(pthread_create(&th2, NULL, th2_func, &fd), 0);
	usleep(400000);
	struct itimerspec t6 = { { 0, 0 }, { 0, MS_TO_NSEC(200) } };
	expect_success(junk, timerfd_settime(fd, 0, &t6, NULL));
	expect(pthread_join(th2, NULL), 0);

	// Check blocking read, with interval
	struct itimerspec t7 = { { 0, MS_TO_NSEC(200) },
		{ 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t7, NULL));
	before = steady_clock_now();
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(600));

	// Check timerfd_gettime():
	struct itimerspec t8 = { { 0, MS_TO_NSEC(400) },
		{ 0, MS_TO_NSEC(300) } };
	expect_success(junk, timerfd_settime(fd, 0, &t8, NULL));
	struct itimerspec tout;
	// Right in the beginning:
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
	expectge(t8.it_value.tv_nsec, tout.it_value.tv_nsec);
	expectge(tout.it_value.tv_nsec,
	    t8.it_value.tv_nsec - (long)MS_TO_NSEC(100));
	// After a while but before expiration:
	usleep(100000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
	expectge(t8.it_value.tv_nsec - (long)MS_TO_NSEC(100),
	    tout.it_value.tv_nsec);
#ifndef ALLOW_TIMER_SLACK
	expectge(tout.it_value.tv_nsec,
	    t8.it_value.tv_nsec - (long)MS_TO_NSEC(200));
#endif
	// After expiration, we have the interval
	usleep(300000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
#ifndef ALLOW_TIMER_SLACK
	expectge(tout.it_value.tv_nsec, (long)MS_TO_NSEC(200));
	expectge((long)MS_TO_NSEC(400), tout.it_value.tv_nsec);
#endif

	// Check timerfd_gettime() after expiration of a single-time timer:
	struct itimerspec t9 = { { 0, 0 }, { 0, MS_TO_NSEC(100) } };
	expect_success(junk, timerfd_settime(fd, 0, &t9, NULL));
	usleep(200000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, (long)0);
	expect(tout.it_interval.tv_nsec, (long)0);
	expect(tout.it_value.tv_sec, (long)0);
	expect(tout.it_value.tv_nsec, (long)0);
	expect(tout.it_value.tv_nsec, (long)0);
}